

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
ptc::Print<char>::print_backend<std::__cxx11::ostringstream&,std::complex<int>&>
          (Print<char> *this,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os,
          complex<int> *first)

{
  size_type sVar1;
  int iVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  ostream *poVar4;
  undefined8 uVar5;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)mutex_);
  if (iVar2 == 0) {
    sVar1 = (this->pattern)._M_string_length;
    if (sVar1 == 0) {
      poVar3 = (ostream *)std::ostream::operator<<(os,first->_M_real);
      uStack_28._0_5_ = CONCAT14(0x2b,(undefined4)uStack_28);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)((long)&uStack_28 + 4),1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,first->_M_imag);
      uStack_28._0_6_ = CONCAT15(0x6a,(undefined5)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_28 + 5),1);
    }
    else {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(this->pattern)._M_dataplus._M_p,sVar1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar3,first->_M_real);
      uStack_28._0_7_ = CONCAT16(0x2b,(undefined6)uStack_28);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)((long)&uStack_28 + 6),1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,first->_M_imag);
      uStack_28 = CONCAT17(0x6a,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_28 + 7),1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,(this->end)._M_dataplus._M_p,(this->end)._M_string_length);
    if (this->flush == true) {
      std::ostream::flush();
    }
    pthread_mutex_unlock((pthread_mutex_t *)mutex_);
    return;
  }
  uVar5 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  _Unwind_Resume(uVar5);
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }